

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t process_head_file_extra(archive_read *a,archive_entry *e,rar5 *rar,int64_t extra_data_size)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  archive_entry *paVar4;
  uint64_t uVar5;
  char cVar6;
  wchar_t wVar7;
  uint64_t uVar8;
  char *pcVar9;
  undefined8 *puVar10;
  int64_t iVar11;
  void *pvVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  int error_number;
  byte bVar16;
  long lVar17;
  wchar_t wVar18;
  uint64_t value_size_1;
  uint64_t value_size;
  uint64_t flags;
  uint64_t id;
  uint64_t var_size;
  uint64_t extra_field_id;
  uint64_t extra_field_size;
  uint64_t v;
  long local_20e0;
  archive_entry *local_20d8;
  uint64_t local_20d0;
  archive_string local_20c8;
  uint64_t local_20a8;
  uint64_t local_20a0;
  uint32_t *local_2098;
  uint32_t *local_2090;
  uint32_t *local_2088;
  uint64_t local_2080;
  uint64_t *local_2078;
  uint64_t *local_2070;
  uint64_t local_2068;
  uint64_t local_2060;
  uint8_t *local_2058;
  int64_t *local_2050;
  int64_t *local_2048;
  int64_t *local_2040;
  archive_string local_2038 [341];
  
  local_2068 = 0;
  if (extra_data_size < 1) {
    wVar18 = L'\xffffffe2';
  }
  else {
    local_2070 = &(rar->file).redir_type;
    local_2078 = &(rar->file).redir_flags;
    local_2088 = &(rar->file).e_mtime_ns;
    local_2090 = &(rar->file).e_ctime_ns;
    local_2098 = &(rar->file).e_atime_ns;
    local_2040 = &(rar->file).e_mtime;
    local_2048 = &(rar->file).e_ctime;
    local_2050 = &(rar->file).e_atime;
    local_2058 = (rar->file).blake2sp;
    wVar18 = L'\xffffffe2';
    local_20e0 = extra_data_size;
    local_20d8 = e;
    do {
      lVar17 = local_20e0;
      wVar7 = read_var(a,&local_2060,&local_2080);
      uVar5 = local_2080;
      if (wVar7 == L'\0') {
        return L'\x01';
      }
      lVar17 = lVar17 - local_2080;
      local_20e0 = lVar17;
      uVar8 = __archive_read_consume(a,local_2080);
      if (uVar8 != uVar5) {
        return L'\x01';
      }
      wVar7 = read_var(a,&local_2068,&local_2080);
      uVar5 = local_2080;
      if (wVar7 == L'\0') {
        return L'\x01';
      }
      local_2060 = local_2060 - local_2080;
      lVar17 = lVar17 - local_2080;
      local_20e0 = lVar17;
      uVar8 = __archive_read_consume(a,local_2080);
      if (uVar8 != uVar5) {
        return L'\x01';
      }
      switch(local_2068) {
      case 1:
        archive_entry_set_is_data_encrypted(local_20d8,'\x01');
        rar->has_encrypted_entries = L'\x01';
        *(byte *)&rar->cstate = *(byte *)&rar->cstate | 0x10;
      default:
        uVar5 = local_2060;
        local_20e0 = lVar17 - local_2060;
        uVar8 = __archive_read_consume(a,local_2060);
        if (uVar8 != uVar5) {
          return L'\x01';
        }
        break;
      case 2:
        local_20c8.s = (char *)0x0;
        wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20c8);
        pcVar14 = local_20c8.s;
        pcVar13 = (char *)0x0;
        if (wVar7 != L'\0') {
          pcVar13 = local_2038[0].s;
        }
        wVar18 = L'\x01';
        if (wVar7 != L'\0') {
          lVar17 = lVar17 - (long)local_20c8.s;
          local_20e0 = lVar17;
          pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s);
          if (pcVar9 == pcVar14) {
            if (pcVar13 == (char *)0x0) {
              local_2038[0].s = (char *)0xffffffffffffffff;
              puVar10 = (undefined8 *)__archive_read_ahead(a,0x20,(ssize_t *)local_2038);
              if (puVar10 != (undefined8 *)0x0) {
                (rar->file).has_blake2 = '\x01';
                uVar1 = *puVar10;
                uVar2 = puVar10[1];
                uVar3 = puVar10[3];
                *(undefined8 *)(local_2058 + 0x10) = puVar10[2];
                *(undefined8 *)(local_2058 + 0x18) = uVar3;
                *(undefined8 *)local_2058 = uVar1;
                *(undefined8 *)(local_2058 + 8) = uVar2;
                iVar11 = __archive_read_consume(a,0x20);
                if (iVar11 == 0x20) {
                  local_20e0 = lVar17 + -0x20;
                  goto LAB_0014742d;
                }
              }
            }
            else {
              archive_set_error(&a->archive,0x54,"Unsupported hash type (0x%jx)",pcVar13);
LAB_0014759b:
              wVar18 = L'\xffffffe2';
            }
          }
        }
        break;
      case 3:
        local_20c8.s = (char *)0x0;
        wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20c8);
        pcVar14 = local_20c8.s;
        uVar15 = 0;
        if (wVar7 != L'\0') {
          uVar15 = (uint)local_2038[0].s;
        }
        wVar18 = L'\x01';
        if (wVar7 != L'\0') {
          local_20e0 = lVar17 - (long)local_20c8.s;
          pcVar13 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s);
          if (pcVar13 == pcVar14) {
            bVar16 = (byte)uVar15 & 1;
            *local_2088 = 0;
            *local_2090 = 0;
            *local_2098 = 0;
            if ((uVar15 & 2) != 0) {
              parse_htime_item(a,bVar16,local_2040,local_2088,&local_20e0);
            }
            if ((uVar15 & 4) != 0) {
              parse_htime_item(a,bVar16,local_2048,local_2090,&local_20e0);
            }
            if ((uVar15 & 8) != 0) {
              parse_htime_item(a,bVar16,local_2050,local_2098,&local_20e0);
            }
            bVar16 = (byte)((uVar15 & 0x10) >> 4) & (byte)uVar15 ^ 1;
            if ((uVar15 & 2) != 0 && bVar16 == 0) {
              cVar6 = read_u32(a,local_2088);
              if (cVar6 == '\0') break;
              local_20e0 = local_20e0 + -4;
            }
            if ((uVar15 & 4) != 0 && bVar16 == 0) {
              cVar6 = read_u32(a,local_2090);
              if (cVar6 == '\0') break;
              local_20e0 = local_20e0 + -4;
            }
            if ((uVar15 & 8) != 0 && bVar16 == 0) {
              cVar6 = read_u32(a,local_2098);
              if (cVar6 == '\0') break;
              local_20e0 = local_20e0 + -4;
            }
            paVar4 = local_20d8;
            if ((uVar15 & 2) != 0) {
              archive_entry_set_mtime(local_20d8,(rar->file).e_mtime,(ulong)(rar->file).e_mtime_ns);
            }
            if ((uVar15 & 4) != 0) {
              archive_entry_set_ctime(paVar4,(rar->file).e_ctime,(ulong)(rar->file).e_ctime_ns);
            }
            wVar18 = L'\0';
            if ((uVar15 & 8) != 0) {
              archive_entry_set_atime(local_20d8,(rar->file).e_atime,(ulong)(rar->file).e_atime_ns);
            }
          }
        }
        break;
      case 4:
        local_20c8.s = (char *)0x0;
        wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20c8);
        pcVar14 = local_20c8.s;
        wVar18 = L'\x01';
        if (wVar7 != L'\0') {
          lVar17 = lVar17 - (long)local_20c8.s;
          local_20e0 = lVar17;
          pcVar13 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s);
          if (pcVar13 == pcVar14) {
            local_20c8.s = (char *)0x0;
            wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)&local_20c8);
            pcVar13 = local_2038[0].s;
            pcVar14 = local_20c8.s;
            if (wVar7 != L'\0') {
              local_20e0 = lVar17 - (long)local_20c8.s;
              pcVar9 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s);
              paVar4 = local_20d8;
              if (pcVar9 == pcVar14) {
                pcVar14 = archive_entry_pathname_utf8(local_20d8);
                if (pcVar14 == (char *)0x0) {
                  error_number = 0x16;
                  pcVar14 = "Version entry without file name";
                  goto LAB_00147594;
                }
                local_2038[0].s = (char *)0x0;
                local_2038[0].length = 0;
                wVar18 = L'\0';
                local_2038[0].buffer_length = 0;
                local_20c8.s = (char *)0x0;
                local_20c8.length = 0;
                local_20c8.buffer_length = 0;
                archive_string_sprintf(local_2038,";%zu",pcVar13);
                archive_strcat(&local_20c8,pcVar14);
                archive_strcat(&local_20c8,local_2038[0].s);
                archive_entry_update_pathname_utf8(paVar4,local_20c8.s);
                archive_string_free(local_2038);
                archive_string_free(&local_20c8);
              }
            }
          }
        }
        break;
      case 5:
        local_20c8.s = (char *)0x0;
        wVar7 = read_var(a,local_2070,(uint64_t *)&local_20c8);
        pcVar14 = local_20c8.s;
        wVar18 = L'\x01';
        if ((wVar7 != L'\0') &&
           (pcVar13 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s), pcVar13 == pcVar14))
        {
          lVar17 = lVar17 - (long)local_20c8.s;
          local_20e0 = lVar17;
          wVar7 = read_var(a,local_2078,(uint64_t *)&local_20c8);
          pcVar14 = local_20c8.s;
          if ((wVar7 != L'\0') &&
             (pcVar13 = (char *)__archive_read_consume(a,(int64_t)local_20c8.s), pcVar13 == pcVar14)
             ) {
            lVar17 = lVar17 - (long)local_20c8.s;
            local_20e0 = lVar17;
            wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)0x0);
            pcVar14 = local_2038[0].s;
            if (wVar7 != L'\0') {
              local_20e0 = lVar17 + ~(ulong)local_2038[0].s;
              if (local_2038[0].s < (char *)0x800) {
                if (local_2038[0].s != (char *)0x0) {
                  local_2038[0].s = (char *)0xffffffffffffffff;
                  pvVar12 = __archive_read_ahead(a,(size_t)pcVar14,(ssize_t *)local_2038);
                  if (pvVar12 != (void *)0x0) {
                    memcpy(local_2038,pvVar12,(size_t)pcVar14);
                    pcVar14[(long)&local_2038[0].s] = '\0';
                    pcVar13 = (char *)__archive_read_consume(a,(int64_t)pcVar14);
                    paVar4 = local_20d8;
                    if (pcVar13 == pcVar14) {
                      wVar18 = L'\0';
                      if (*local_2070 - 1 < 2) {
                        archive_entry_set_filetype(local_20d8,0xa000);
                        archive_entry_update_symlink_utf8(paVar4,(char *)local_2038);
                        if ((*local_2078 & 1) == 0) {
                          wVar7 = L'\x01';
                        }
                        else {
                          wVar7 = L'\x02';
                        }
                        archive_entry_set_symlink_type(paVar4,wVar7);
                      }
                      else if (*local_2070 == 4) {
                        archive_entry_set_filetype(local_20d8,0x8000);
                        archive_entry_update_hardlink_utf8(paVar4,(char *)local_2038);
                        wVar18 = L'\0';
                      }
                    }
                  }
                  break;
                }
                error_number = 0x54;
                pcVar14 = "No link target specified";
              }
              else {
                error_number = 0x54;
                pcVar14 = "Link target is too long";
              }
LAB_00147594:
              archive_set_error(&a->archive,error_number,pcVar14);
              goto LAB_0014759b;
            }
          }
        }
        break;
      case 6:
        local_20a8 = 0;
        local_20d0 = 0;
        local_20a0 = 0;
        wVar7 = read_var(a,&local_20a8,&local_20d0);
        uVar5 = local_20d0;
        wVar18 = L'\x01';
        if ((wVar7 != L'\0') && (uVar8 = __archive_read_consume(a,local_20d0), uVar8 == uVar5)) {
          lVar17 = lVar17 - local_20d0;
          local_20e0 = lVar17;
          if ((local_20a8 & 1) == 0) {
LAB_0014725f:
            if ((local_20a8 & 2) == 0) {
LAB_0014726a:
              if ((local_20a8 & 4) != 0) {
                wVar7 = read_var(a,&local_20a0,&local_20d0);
                uVar5 = local_20d0;
                if ((wVar7 == L'\0') ||
                   (uVar8 = __archive_read_consume(a,local_20d0), uVar8 != uVar5)) break;
                local_20e0 = local_20e0 - local_20d0;
                archive_entry_set_uid(local_20d8,local_20a0);
              }
              if ((local_20a8 & 8) != 0) {
                wVar7 = read_var(a,&local_20a0,&local_20d0);
                uVar5 = local_20d0;
                if ((wVar7 == L'\0') ||
                   (uVar8 = __archive_read_consume(a,local_20d0), uVar8 != uVar5)) break;
                local_20e0 = local_20e0 - local_20d0;
                archive_entry_set_gid(local_20d8,local_20a0);
              }
LAB_0014742d:
              wVar18 = L'\0';
            }
            else {
              wVar7 = read_var(a,(uint64_t *)&local_20c8,(uint64_t *)0x0);
              pcVar14 = local_20c8.s;
              if (wVar7 != L'\0') {
                local_20e0 = local_20e0 + ~(ulong)local_20c8.s;
                local_20c8.s = (char *)0xffffffffffffffff;
                pvVar12 = __archive_read_ahead(a,(size_t)pcVar14,(ssize_t *)&local_20c8);
                if (pvVar12 != (void *)0x0) {
                  pcVar13 = (char *)0xff;
                  if (pcVar14 < (char *)0xff) {
                    pcVar13 = pcVar14;
                  }
                  memcpy(local_2038,pvVar12,(size_t)pcVar13);
                  pcVar13[(long)&local_2038[0].s] = '\0';
                  pcVar13 = (char *)__archive_read_consume(a,(int64_t)pcVar14);
                  if (pcVar13 == pcVar14) {
                    archive_entry_set_gname(local_20d8,(char *)local_2038);
                    goto LAB_0014726a;
                  }
                }
              }
            }
          }
          else {
            wVar7 = read_var(a,(uint64_t *)local_2038,(uint64_t *)0x0);
            pcVar14 = local_2038[0].s;
            if (wVar7 != L'\0') {
              local_20e0 = lVar17 + ~(ulong)local_2038[0].s;
              local_2038[0].s = (char *)0xffffffffffffffff;
              pvVar12 = __archive_read_ahead(a,(size_t)pcVar14,(ssize_t *)local_2038);
              if (pvVar12 != (void *)0x0) {
                pcVar13 = (char *)0xff;
                if (pcVar14 < (char *)0xff) {
                  pcVar13 = pcVar14;
                }
                memcpy(local_2038,pvVar12,(size_t)pcVar13);
                pcVar13[(long)&local_2038[0].s] = '\0';
                pcVar13 = (char *)__archive_read_consume(a,(int64_t)pcVar14);
                if (pcVar13 == pcVar14) {
                  archive_entry_set_uname(local_20d8,(char *)local_2038);
                  goto LAB_0014725f;
                }
              }
            }
          }
        }
      }
    } while (0 < local_20e0);
  }
  return wVar18;
}

Assistant:

static int process_head_file_extra(struct archive_read* a,
    struct archive_entry* e, struct rar5* rar, int64_t extra_data_size)
{
	uint64_t extra_field_size;
	uint64_t extra_field_id = 0;
	int ret = ARCHIVE_FATAL;
	uint64_t var_size;

	while(extra_data_size > 0) {
		if(!read_var(a, &extra_field_size, &var_size))
			return ARCHIVE_EOF;

		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		if(!read_var(a, &extra_field_id, &var_size))
			return ARCHIVE_EOF;

		extra_field_size -= var_size;
		extra_data_size -= var_size;
		if(ARCHIVE_OK != consume(a, var_size)) {
			return ARCHIVE_EOF;
		}

		switch(extra_field_id) {
			case EX_HASH:
				ret = parse_file_extra_hash(a, rar,
				    &extra_data_size);
				break;
			case EX_HTIME:
				ret = parse_file_extra_htime(a, e, rar,
				    &extra_data_size);
				break;
			case EX_REDIR:
				ret = parse_file_extra_redir(a, e, rar,
				    &extra_data_size);
				break;
			case EX_UOWNER:
				ret = parse_file_extra_owner(a, e,
				    &extra_data_size);
				break;
			case EX_VERSION:
				ret = parse_file_extra_version(a, e,
				    &extra_data_size);
				break;
			case EX_CRYPT:
				/* Mark the entry as encrypted */
				archive_entry_set_is_data_encrypted(e, 1);
				rar->has_encrypted_entries = 1;
				rar->cstate.data_encrypted = 1;
				/* fallthrough */
			case EX_SUBDATA:
				/* fallthrough */
			default:
				/* Skip unsupported entry. */
				extra_data_size -= extra_field_size;
				if (ARCHIVE_OK != consume(a, extra_field_size)) {
					return ARCHIVE_EOF;
				}
		}
	}

	if(ret != ARCHIVE_OK) {
		/* Attribute not implemented. */
		return ret;
	}

	return ARCHIVE_OK;
}